

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O3

void GPU_SetTargetRGB(GPU_Target *target,Uint8 r,Uint8 g,Uint8 b)

{
  if (target != (GPU_Target *)0x0) {
    target->use_color = (g & r & b) != 0xff;
    (target->color).r = r;
    (target->color).g = g;
    (target->color).b = b;
    (target->color).a = 0xff;
  }
  return;
}

Assistant:

void GPU_SetTargetRGB(GPU_Target* target, Uint8 r, Uint8 g, Uint8 b)
{
    SDL_Color c;
    c.r = r;
    c.g = g;
    c.b = b;
    GET_ALPHA(c) = 255;

    if(target == NULL)
        return;

    target->use_color = !(r == 255 && g == 255 && b == 255);
    target->color = c;
}